

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL>::SmallVector
          (SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *this)

{
  pair<unsigned_int,_unsigned_int> *ppVar1;
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *this_local;
  
  VectorView<std::pair<unsigned_int,_unsigned_int>_>::VectorView
            (&this->super_VectorView<std::pair<unsigned_int,_unsigned_int>_>);
  this->buffer_capacity = 0;
  ppVar1 = AlignedBuffer<std::pair<unsigned_int,_unsigned_int>,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<std::pair<unsigned_int,_unsigned_int>_>).ptr = ppVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}